

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int resolveAsName(Parse *pParse,ExprList *pEList,Expr *pE)

{
  Expr *zRight;
  int iVar1;
  Vdbe **ppVVar2;
  ulong unaff_RBP;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  bool bVar6;
  
  iVar1 = (int)unaff_RBP;
  if ((char)pEList->nExpr == ';') {
    uVar3 = (ulong)*(int *)&pParse->db;
    bVar5 = 0 < (long)uVar3;
    if (0 < (long)uVar3) {
      zRight = pEList->a[0].pExpr;
      ppVVar2 = &pParse->pVdbe;
      uVar4 = 1;
      do {
        if (*ppVVar2 == (Vdbe *)0x0) {
          bVar6 = true;
        }
        else {
          iVar1 = sqlite3StrICmp((char *)*ppVVar2,(char *)zRight);
          bVar6 = iVar1 != 0;
          if (!bVar6) {
            unaff_RBP = uVar4;
          }
          unaff_RBP = unaff_RBP & 0xffffffff;
        }
        iVar1 = (int)unaff_RBP;
        if (!bVar6) break;
        bVar5 = uVar4 < uVar3;
        ppVVar2 = ppVVar2 + 4;
        bVar6 = uVar4 != uVar3;
        uVar4 = uVar4 + 1;
      } while (bVar6);
    }
    if (bVar5) {
      return iVar1;
    }
  }
  return 0;
}

Assistant:

static int resolveAsName(
  Parse *pParse,     /* Parsing context for error messages */
  ExprList *pEList,  /* List of expressions to scan */
  Expr *pE           /* Expression we are trying to match */
){
  int i;             /* Loop counter */

  UNUSED_PARAMETER(pParse);

  if( pE->op==TK_ID ){
    char *zCol = pE->u.zToken;
    for(i=0; i<pEList->nExpr; i++){
      char *zAs = pEList->a[i].zName;
      if( zAs!=0 && sqlite3StrICmp(zAs, zCol)==0 ){
        return i+1;
      }
    }
  }
  return 0;
}